

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdShift<long,long>(Thread *this,BinopFunc<long,_long> *f)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  Simd<long,_(unsigned_char)__x02_> SVar4;
  
  uVar1 = Pop<unsigned_int>(this);
  SVar4 = Pop<wabt::interp::Simd<long,(unsigned_char)2>>(this);
  lVar2 = (*f)(SVar4.v[0],(long)uVar1);
  lVar3 = (*f)(SVar4.v[1],(long)uVar1);
  SVar4.v[1] = lVar3;
  SVar4.v[0] = lVar2;
  Push<wabt::interp::Simd<long,(unsigned_char)2>>(this,SVar4);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShift(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto amount = Pop<u32>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], amount);
  }
  Push(result);
  return RunResult::Ok;
}